

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil_rand.c
# Opt level: O0

void evutil_secure_rng_add_bytes(char *buf,size_t n)

{
  undefined4 local_24;
  size_t n_local;
  char *buf_local;
  
  if (n < 0x80000000) {
    local_24 = (int)n;
  }
  else {
    local_24 = 0x7fffffff;
  }
  arc4random_addrandom((uchar *)buf,local_24);
  return;
}

Assistant:

void
evutil_secure_rng_add_bytes(const char *buf, size_t n)
{
	arc4random_addrandom((unsigned char*)buf,
	    n>(size_t)INT_MAX ? INT_MAX : (int)n);
}